

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O0

void nn_recv_loop(nn_options_t *options,int sock)

{
  int *piVar1;
  char *local_20;
  void *buf;
  int rc;
  int sock_local;
  nn_options_t *options_local;
  
  buf._4_4_ = sock;
  _rc = options;
LAB_00103d8f:
  buf._0_4_ = nn_recv(buf._4_4_,&local_20,0xffffffffffffffff,0);
  if ((int)buf < 0) goto code_r0x00103dad;
  goto LAB_00103db9;
code_r0x00103dad:
  piVar1 = __errno_location();
  if (*piVar1 != 0xb) {
LAB_00103db9:
    if (((int)buf < 0) &&
       ((piVar1 = __errno_location(), *piVar1 == 0x6e ||
        (piVar1 = __errno_location(), *piVar1 == 0x9523dfe)))) {
      return;
    }
    nn_assert_errno((uint)(-1 < (int)buf),"Can\'t recv");
    nn_print_message(_rc,local_20,(int)buf);
    nn_freemsg(local_20);
  }
  goto LAB_00103d8f;
}

Assistant:

void nn_recv_loop (nn_options_t *options, int sock)
{
    int rc;
    void *buf;

    for (;;) {
        rc = nn_recv (sock, &buf, NN_MSG, 0);
        if (rc < 0 && errno == EAGAIN) {
            continue;
        } else if (rc < 0 && (errno == ETIMEDOUT || errno == EFSM)) {
            return;  /*  No more messages possible  */
        } else {
            nn_assert_errno (rc >= 0, "Can't recv");
        }
        nn_print_message (options, buf, rc);
        nn_freemsg (buf);
    }
}